

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastErR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  RepeatedField<int> *this;
  ulong uVar4;
  uint *puVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 data_00;
  ulong uVar6;
  int value;
  char *pcVar7;
  int iVar8;
  ushort *puVar9;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  data_00 = data.field_0;
  this = RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
  cVar1 = *ptr;
  uVar3 = *(uint *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  iVar8 = (int)(short)uVar3;
  do {
    pcVar7 = (char *)(long)*(char *)((long)ptr + 1);
    if ((long)pcVar7 < 0) {
      uVar4 = (long)(char)*(ushort *)((long)ptr + 2) << 7 | 0x7f;
      if ((long)uVar4 < 0) {
        data_00.data = (long)*(char *)((long)ptr + 3) << 0xe | 0x3fff;
        if ((long)data_00 < 0) {
          uVar4 = uVar4 & ((long)(char)*(ushort *)((long)ptr + 4) << 0x15 | 0x1fffffU);
          if ((long)uVar4 < 0) {
            data_00.data = data_00.data & ((long)*(char *)((long)ptr + 5) << 0x1c | 0xfffffffU);
            if ((long)data_00.data < 0) {
              uVar4 = uVar4 & ((long)(char)*(ushort *)((long)ptr + 6) << 0x23 | 0x7ffffffffU);
              if ((long)uVar4 < 0) {
                data_00.data = data_00.data &
                               ((long)*(char *)((long)ptr + 7) << 0x2a | 0x3ffffffffffU);
                if ((long)data_00 < 0) {
                  uVar4 = uVar4 & ((long)(char)*(ushort *)((long)ptr + 8) << 0x31 | 0x1ffffffffffffU
                                  );
                  if ((long)uVar4 < 0) {
                    uVar6 = (ulong)*(byte *)((long)ptr + 9) << 0x38 | 0xffffffffffffff;
                    data_00.data = data_00.data & uVar6;
                    if ((long)data_00 < 0) {
                      puVar9 = (ushort *)((long)ptr + 0xb);
                      bVar2 = (byte)*(ushort *)((long)ptr + 10);
                      if (bVar2 != 1) {
                        if ((char)bVar2 < '\0') {
                          pcVar7 = Error(msg,pcVar7,
                                         (ParseContext *)CONCAT71((int7)(uVar6 >> 8),bVar2),
                                         (TcFieldData)data_00,table,hasbits);
                          return pcVar7;
                        }
                        if ((bVar2 & 1) == 0) {
                          data_00.data = data_00.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      puVar9 = (ushort *)((long)ptr + 10);
                    }
                  }
                  else {
                    puVar9 = (ushort *)((long)ptr + 9);
                  }
                }
                else {
                  puVar9 = (ushort *)((long)ptr + 8);
                }
              }
              else {
                puVar9 = (ushort *)((long)ptr + 7);
              }
            }
            else {
              puVar9 = (ushort *)((long)ptr + 6);
            }
          }
          else {
            puVar9 = (ushort *)((long)ptr + 5);
          }
        }
        else {
          puVar9 = (ushort *)((long)ptr + 4);
        }
        uVar4 = uVar4 & data_00.data;
      }
      else {
        puVar9 = (ushort *)((long)ptr + 3);
      }
      pcVar7 = (char *)((ulong)pcVar7 & uVar4);
    }
    else {
      puVar9 = (ushort *)((long)ptr + 2);
    }
    value = (int)pcVar7;
    if ((value < iVar8) || ((int)((uVar3 >> 0x10) + iVar8) <= value)) {
      pcVar7 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar7;
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar9) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar5 = *puVar5 | (uint)hasbits;
      }
      return (char *)puVar9;
    }
    ptr = (char *)puVar9;
  } while ((char)*puVar9 == cVar1);
  uVar3 = (uint)table->fast_idx_mask & (uint)*puVar9;
  if ((uVar3 & 7) == 0) {
    uVar4 = (ulong)(uVar3 & 0xfffffff8);
    pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                               (msg,puVar9,ctx,
                                (ulong)*puVar9 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                table,hasbits);
    return pcVar7;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastErR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint8_t, field_layout::kTvRange>(
      PROTOBUF_TC_PARAM_PASS);
}